

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O2

IOTHUB_REGISTRYMANAGER_RESULT
sendHttpRequestCRUD(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,
                   IOTHUB_REQUEST_MODE iotHubRequestMode,char *deviceName,char *moduleId,
                   BUFFER_HANDLE deviceJsonBuffer,size_t numberOfDevices,
                   BUFFER_HANDLE responseBuffer)

{
  HTTP_HEADERS_RESULT HVar1;
  int iVar2;
  HTTPAPIEX_RESULT HVar3;
  STRING_HANDLE uriResource;
  STRING_HANDLE key;
  STRING_HANDLE keyName;
  LOGGER_LOG p_Var4;
  HTTP_HEADERS_HANDLE httpHeadersHandle;
  HTTPAPIEX_SAS_HANDLE sasHandle;
  HTTPAPIEX_HANDLE handle;
  size_t sVar5;
  HTTPAPI_REQUEST_TYPE requestType;
  IOTHUB_REGISTRYMANAGER_RESULT IVar6;
  char *pcVar7;
  char relativePath [256];
  uint statusCode;
  
  if (registryManagerHandle->deviceId == (char *)0x0) {
    uriResource = STRING_construct(registryManagerHandle->hostname);
  }
  else {
    uriResource = STRING_construct_sprintf("%s%%2Fdevices%%2F%s");
  }
  if (uriResource == (STRING_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      pcVar7 = "STRING_construct failed for uriResource";
      iVar2 = 0x48a;
LAB_00131cf2:
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                ,"sendHttpRequestCRUD",iVar2,1,pcVar7);
    }
  }
  else {
    key = STRING_construct(registryManagerHandle->sharedAccessKey);
    if (key != (STRING_HANDLE)0x0) {
      if (registryManagerHandle->keyName == (char *)0x0) {
        keyName = (STRING_HANDLE)0x0;
      }
      else {
        keyName = STRING_construct(registryManagerHandle->keyName);
        if (keyName == (STRING_HANDLE)0x0) {
          p_Var4 = xlogging_get_log_function();
          IVar6 = IOTHUB_REGISTRYMANAGER_ERROR;
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                      ,"sendHttpRequestCRUD",0x494,1,"STRING_construct failed for keyName");
          }
          httpHeadersHandle = (HTTP_HEADERS_HANDLE)0x0;
          handle = (HTTPAPIEX_HANDLE)0x0;
          sasHandle = (HTTPAPIEX_SAS_HANDLE)0x0;
          keyName = (STRING_HANDLE)0x0;
          goto LAB_00132386;
        }
      }
      httpHeadersHandle = HTTPHeaders_Alloc();
      if (httpHeadersHandle == (HTTP_HEADERS_HANDLE)0x0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00131f1b;
        httpHeadersHandle = (HTTP_HEADERS_HANDLE)0x0;
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                  ,"createHttpHeader",0x443,1,"HTTPHeaders_Alloc failed");
      }
      else {
        HVar1 = HTTPHeaders_AddHeaderNameValuePair(httpHeadersHandle,"Authorization"," ");
        if (HVar1 == HTTP_HEADERS_OK) {
          HVar1 = HTTPHeaders_AddHeaderNameValuePair(httpHeadersHandle,"Request-Id","1001");
          if (HVar1 == HTTP_HEADERS_OK) {
            HVar1 = HTTPHeaders_AddHeaderNameValuePair
                              (httpHeadersHandle,"User-Agent","iothubserviceclient/1.1.0");
            if (HVar1 == HTTP_HEADERS_OK) {
              HVar1 = HTTPHeaders_AddHeaderNameValuePair
                                (httpHeadersHandle,"Accept","application/json");
              if (HVar1 == HTTP_HEADERS_OK) {
                HVar1 = HTTPHeaders_AddHeaderNameValuePair
                                  (httpHeadersHandle,"Content-Type",
                                   "application/json; charset=utf-8");
                if (HVar1 == HTTP_HEADERS_OK) goto LAB_00131f1e;
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  pcVar7 = "HTTPHeaders_AddHeaderNameValuePair failed for Content-Type header";
                  iVar2 = 0x45f;
                  goto LAB_00131f0e;
                }
              }
              else {
                p_Var4 = xlogging_get_log_function();
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  pcVar7 = "HTTPHeaders_AddHeaderNameValuePair failed for Accept header";
                  iVar2 = 0x459;
                  goto LAB_00131f0e;
                }
              }
            }
            else {
              p_Var4 = xlogging_get_log_function();
              if (p_Var4 != (LOGGER_LOG)0x0) {
                pcVar7 = "HTTPHeaders_AddHeaderNameValuePair failed for User-Agent header";
                iVar2 = 0x453;
                goto LAB_00131f0e;
              }
            }
          }
          else {
            p_Var4 = xlogging_get_log_function();
            if (p_Var4 != (LOGGER_LOG)0x0) {
              pcVar7 = "HTTPHeaders_AddHeaderNameValuePair failed for RequestId header";
              iVar2 = 0x44d;
              goto LAB_00131f0e;
            }
          }
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            pcVar7 = "HTTPHeaders_AddHeaderNameValuePair failed for Authorization header";
            iVar2 = 0x447;
LAB_00131f0e:
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                      ,"createHttpHeader",iVar2,1,pcVar7);
          }
        }
        HTTPHeaders_Free(httpHeadersHandle);
LAB_00131f1b:
        httpHeadersHandle = (HTTP_HEADERS_HANDLE)0x0;
      }
LAB_00131f1e:
      if ((iotHubRequestMode - IOTHUB_REQUEST_UPDATE < 2) &&
         (HVar1 = HTTPHeaders_AddHeaderNameValuePair(httpHeadersHandle,"If-Match","*"),
         HVar1 != HTTP_HEADERS_OK)) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                    ,"createHttpHeader",0x468,1,
                    "HTTPHeaders_AddHeaderNameValuePair failed for If-Match header");
        }
        HTTPHeaders_Free(httpHeadersHandle);
      }
      else if (httpHeadersHandle != (HTTP_HEADERS_HANDLE)0x0) {
        sasHandle = HTTPAPIEX_SAS_Create(key,uriResource,keyName);
        if (sasHandle == (HTTPAPIEX_SAS_HANDLE)0x0) {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                      ,"sendHttpRequestCRUD",0x49e,1,"HTTPAPIEX_SAS_Create failed");
          }
          sasHandle = (HTTPAPIEX_SAS_HANDLE)0x0;
        }
        else {
          handle = HTTPAPIEX_Create(registryManagerHandle->hostname);
          if (handle != (HTTPAPIEX_HANDLE)0x0) {
            if (iotHubRequestMode < (IOTHUB_REQUEST_GET_STATISTICS|IOTHUB_REQUEST_CREATE)) {
              if ((100U >> (iotHubRequestMode & 0x1f) & 1) == 0) {
                if ((10U >> (iotHubRequestMode & 0x1f) & 1) == 0) {
                  if (iotHubRequestMode != IOTHUB_REQUEST_DELETE) goto LAB_001321b0;
                  requestType = HTTPAPI_REQUEST_DELETE;
                }
                else {
                  requestType = HTTPAPI_REQUEST_PUT;
                }
LAB_00132221:
                if (moduleId == (char *)0x0) {
                  iVar2 = snprintf(relativePath,0x100,"/devices/%s?%s",deviceName,
                                   "api-version=2020-09-30");
                }
                else {
                  iVar2 = snprintf(relativePath,0x100,"/devices/%s/modules/%s?%s",deviceName,
                                   moduleId,"api-version=2020-09-30");
                }
                if (iVar2 < 1) {
LAB_001322f2:
                  p_Var4 = xlogging_get_log_function();
                  IVar6 = IOTHUB_REGISTRYMANAGER_ERROR;
                  if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00132386;
                  pcVar7 = "Failure creating relative path";
                  iVar2 = 0x4c7;
                  goto LAB_00132327;
                }
              }
              else {
                if (deviceName == (char *)0x0 && iotHubRequestMode == IOTHUB_REQUEST_GET_DEVICE_LIST
                   ) {
                  sVar5 = 1000;
                  if (numberOfDevices != 0) {
                    sVar5 = numberOfDevices;
                  }
                  iVar2 = snprintf((char *)&statusCode,0x100,"%lu",sVar5);
                  if (iVar2 < 1) goto LAB_001322f2;
                  iVar2 = snprintf(relativePath,0x100,"/devices/?top=%s&%s",&statusCode,
                                   "api-version=2020-09-30");
LAB_00132212:
                  if (iVar2 < 1) goto LAB_001322f2;
                }
                else {
                  if (deviceName == (char *)0x0 ||
                      iotHubRequestMode != IOTHUB_REQUEST_GET_DEVICE_LIST) {
                    if (iotHubRequestMode != IOTHUB_REQUEST_GET_STATISTICS) {
                      requestType = HTTPAPI_REQUEST_GET;
                      goto LAB_00132221;
                    }
                    iVar2 = snprintf(relativePath,0x100,"/statistics/devices?%s",
                                     "api-version=2020-09-30");
                    goto LAB_00132212;
                  }
                  iVar2 = snprintf(relativePath,0x100,"/devices/%s/modules?%s",deviceName,
                                   "api-version=2020-09-30");
                  if (iVar2 == 0) goto LAB_001322f2;
                }
                requestType = HTTPAPI_REQUEST_GET;
              }
              HVar3 = HTTPAPIEX_SAS_ExecuteRequest
                                (sasHandle,handle,requestType,relativePath,httpHeadersHandle,
                                 deviceJsonBuffer,&statusCode,(HTTP_HEADERS_HANDLE)0x0,
                                 responseBuffer);
              if (HVar3 != HTTPAPIEX_OK) {
                p_Var4 = xlogging_get_log_function();
                IVar6 = IOTHUB_REGISTRYMANAGER_HTTPAPI_ERROR;
                if (p_Var4 != (LOGGER_LOG)0x0) {
                  (*p_Var4)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                            ,"sendHttpRequestCRUD",0x4cc,1,
                            "HTTPAPIEX_SAS_ExecuteRequest failed. Host:%s",
                            registryManagerHandle->hostname);
                }
                goto LAB_00132386;
              }
              IVar6 = IOTHUB_REGISTRYMANAGER_OK;
              if (statusCode < 0x12d) goto LAB_00132386;
              if (statusCode == 0x199 && iotHubRequestMode == IOTHUB_REQUEST_CREATE) {
                IVar6 = IOTHUB_REGISTRYMANAGER_DEVICE_EXIST;
                goto LAB_00132386;
              }
              if (statusCode == 0x194 && iotHubRequestMode == IOTHUB_REQUEST_GET) {
                IVar6 = IOTHUB_REGISTRYMANAGER_DEVICE_NOT_EXIST;
                goto LAB_00132386;
              }
              p_Var4 = xlogging_get_log_function();
              IVar6 = IOTHUB_REGISTRYMANAGER_HTTP_STATUS_ERROR;
              if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00132386;
              pcVar7 = "Http Failure status code %d.";
              iVar2 = 0x4dd;
            }
            else {
LAB_001321b0:
              p_Var4 = xlogging_get_log_function();
              IVar6 = IOTHUB_REGISTRYMANAGER_HTTPAPI_ERROR;
              if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00132386;
              pcVar7 = "Invalid request type";
              iVar2 = 0x4c0;
            }
LAB_00132327:
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                      ,"sendHttpRequestCRUD",iVar2,1,pcVar7);
            goto LAB_00132386;
          }
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                      ,"sendHttpRequestCRUD",0x4a3,1,"HTTPAPIEX_Create failed");
          }
        }
        IVar6 = IOTHUB_REGISTRYMANAGER_HTTPAPI_ERROR;
        handle = (HTTPAPIEX_HANDLE)0x0;
        goto LAB_00132386;
      }
      p_Var4 = xlogging_get_log_function();
      IVar6 = IOTHUB_REGISTRYMANAGER_HTTPAPI_ERROR;
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                  ,"sendHttpRequestCRUD",0x499,1,"HttpHeader creation failed");
      }
      handle = (HTTPAPIEX_HANDLE)0x0;
      sasHandle = (HTTPAPIEX_SAS_HANDLE)0x0;
      httpHeadersHandle = (HTTP_HEADERS_HANDLE)0x0;
      goto LAB_00132386;
    }
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      pcVar7 = "STRING_construct failed for accessKey";
      iVar2 = 0x48f;
      goto LAB_00131cf2;
    }
  }
  IVar6 = IOTHUB_REGISTRYMANAGER_ERROR;
  httpHeadersHandle = (HTTP_HEADERS_HANDLE)0x0;
  handle = (HTTPAPIEX_HANDLE)0x0;
  sasHandle = (HTTPAPIEX_SAS_HANDLE)0x0;
  keyName = (STRING_HANDLE)0x0;
  key = (STRING_HANDLE)0x0;
LAB_00132386:
  HTTPHeaders_Free(httpHeadersHandle);
  HTTPAPIEX_Destroy(handle);
  HTTPAPIEX_SAS_Destroy(sasHandle);
  STRING_delete(keyName);
  STRING_delete(key);
  STRING_delete(uriResource);
  return IVar6;
}

Assistant:

static IOTHUB_REGISTRYMANAGER_RESULT sendHttpRequestCRUD(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, IOTHUB_REQUEST_MODE iotHubRequestMode, const char* deviceName, const char* moduleId, BUFFER_HANDLE deviceJsonBuffer, size_t numberOfDevices, BUFFER_HANDLE responseBuffer)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    STRING_HANDLE uriResource = NULL;
    STRING_HANDLE accessKey = NULL;
    STRING_HANDLE keyName = NULL;
    HTTPAPIEX_SAS_HANDLE httpExApiSasHandle = NULL;
    HTTPAPIEX_HANDLE httpExApiHandle = NULL;
    HTTP_HEADERS_HANDLE httpHeader = NULL;

    if ((uriResource = createUriPath(registryManagerHandle)) == NULL)
    {
        LogError("STRING_construct failed for uriResource");
        result = IOTHUB_REGISTRYMANAGER_ERROR;
    }
    else if ((accessKey = STRING_construct(registryManagerHandle->sharedAccessKey)) == NULL)
    {
        LogError("STRING_construct failed for accessKey");
        result = IOTHUB_REGISTRYMANAGER_ERROR;
    }
    else if ((registryManagerHandle->keyName != NULL) && ((keyName = STRING_construct(registryManagerHandle->keyName)) == NULL))
    {
        LogError("STRING_construct failed for keyName");
        result = IOTHUB_REGISTRYMANAGER_ERROR;
    }
    else if ((httpHeader = createHttpHeader(iotHubRequestMode)) == NULL)
    {
        LogError("HttpHeader creation failed");
        result = IOTHUB_REGISTRYMANAGER_HTTPAPI_ERROR;
    }
    else if ((httpExApiSasHandle = HTTPAPIEX_SAS_Create(accessKey, uriResource, keyName)) == NULL)
    {
        LogError("HTTPAPIEX_SAS_Create failed");
        result = IOTHUB_REGISTRYMANAGER_HTTPAPI_ERROR;
    }
    else if ((httpExApiHandle = HTTPAPIEX_Create(registryManagerHandle->hostname)) == NULL)
    {
        LogError("HTTPAPIEX_Create failed");
        result = IOTHUB_REGISTRYMANAGER_HTTPAPI_ERROR;
    }
    else
    {
        HTTPAPI_REQUEST_TYPE httpApiRequestType = HTTPAPI_REQUEST_GET;
        char relativePath[256];
        unsigned int statusCode;
        unsigned char is_error = 0;

        if ((iotHubRequestMode == IOTHUB_REQUEST_CREATE) || (iotHubRequestMode == IOTHUB_REQUEST_UPDATE))
        {
            httpApiRequestType = HTTPAPI_REQUEST_PUT;
        }
        else if (iotHubRequestMode == IOTHUB_REQUEST_DELETE)
        {
            httpApiRequestType = HTTPAPI_REQUEST_DELETE;
        }
        else if ((iotHubRequestMode == IOTHUB_REQUEST_GET) || (iotHubRequestMode == IOTHUB_REQUEST_GET_DEVICE_LIST) || (iotHubRequestMode == IOTHUB_REQUEST_GET_STATISTICS))
        {
            httpApiRequestType = HTTPAPI_REQUEST_GET;
        }
        else
        {
            is_error = 1;
        }

        if (is_error)
        {
            LogError("Invalid request type");
            result = IOTHUB_REGISTRYMANAGER_HTTPAPI_ERROR;
        }
        else
        {
            if (createRelativePath(iotHubRequestMode, deviceName, moduleId, numberOfDevices, relativePath) != IOTHUB_REGISTRYMANAGER_OK)
            {
                LogError("Failure creating relative path");
                result = IOTHUB_REGISTRYMANAGER_ERROR;
            }
            else if (HTTPAPIEX_SAS_ExecuteRequest(httpExApiSasHandle, httpExApiHandle, httpApiRequestType, relativePath, httpHeader, deviceJsonBuffer, &statusCode, NULL, responseBuffer) != HTTPAPIEX_OK)
            {
                LogError("HTTPAPIEX_SAS_ExecuteRequest failed. Host:%s", registryManagerHandle->hostname);
                result = IOTHUB_REGISTRYMANAGER_HTTPAPI_ERROR;
            }
            else
            {
                if (statusCode > 300)
                {
                    if ((iotHubRequestMode == IOTHUB_REQUEST_CREATE) && (statusCode == 409))
                    {
                        result = IOTHUB_REGISTRYMANAGER_DEVICE_EXIST;
                    }
                    else if ((iotHubRequestMode == IOTHUB_REQUEST_GET) && (statusCode == 404))
                    {
                        result = IOTHUB_REGISTRYMANAGER_DEVICE_NOT_EXIST;
                    }
                    else
                    {
                        LogError("Http Failure status code %d.", statusCode);
                        result = IOTHUB_REGISTRYMANAGER_HTTP_STATUS_ERROR;
                    }
                }
                else
                {
                    result = IOTHUB_REGISTRYMANAGER_OK;
                }
            }
        }
    }

    HTTPHeaders_Free(httpHeader);
    HTTPAPIEX_Destroy(httpExApiHandle);
    HTTPAPIEX_SAS_Destroy(httpExApiSasHandle);
    STRING_delete(keyName);
    STRING_delete(accessKey);
    STRING_delete(uriResource);
    return result;
}